

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcActionRequest::IfcActionRequest(IfcActionRequest *this)

{
  IfcActionRequest *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x110,"IfcActionRequest");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00f5de80);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>,
             &PTR_construction_vtable_24__00f5df30);
  *(undefined8 *)this = 0xf5dda0;
  *(undefined8 *)&this->field_0x110 = 0xf5de68;
  *(undefined8 *)&this->field_0x88 = 0xf5ddc8;
  *(undefined8 *)&this->field_0x98 = 0xf5ddf0;
  *(undefined8 *)&this->field_0xd0 = 0xf5de18;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf5de40;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcActionRequest,_1UL>).field_0x10)
  ;
  return;
}

Assistant:

IfcActionRequest() : Object("IfcActionRequest") {}